

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_bool grapheme_break_extended(int lbc,int tbc,utf8proc_int32_t *state)

{
  int iVar1;
  uint uVar2;
  utf8proc_int32_t uVar3;
  utf8proc_bool uVar4;
  
  if ((state == (utf8proc_int32_t *)0x0) || (uVar2 = *state, *state == 0)) {
    uVar2 = lbc;
  }
  uVar4 = true;
  if (uVar2 != 0) {
    if (tbc == 3 && uVar2 == 2) goto LAB_0013535e;
    if (2 < tbc - 2U && 2 < uVar2 - 2) {
      if ((uVar2 == 9) || (uVar2 == 7)) {
        if (1 < tbc - 7U) goto LAB_001353fb;
      }
      else if (((uVar2 != 6) || (4 < tbc - 6U)) || ((0x1bU >> (tbc - 6U & 0x1f) & 1) == 0)) {
LAB_001353fb:
        uVar4 = false;
        if ((uVar2 == 0xd) || (tbc == 8 && (uVar2 & 0xfffffffd) == 8)) goto LAB_0013537d;
        if ((0xe < (uint)tbc) || ((0x5020U >> (tbc & 0x1fU) & 1) == 0)) {
          if (((tbc != 0x10) || (uVar2 != 0xf && uVar2 != 0x12)) &&
             (1 < tbc - 0x11U || uVar2 != 0xe)) {
            uVar4 = tbc != 0xb || uVar2 != 0xb;
            goto LAB_0013537d;
          }
        }
      }
LAB_0013535e:
      uVar4 = false;
    }
  }
LAB_0013537d:
  if (state == (utf8proc_int32_t *)0x0) {
    return uVar4;
  }
  iVar1 = *state;
  uVar3 = 1;
  if (iVar1 != 0xb || tbc != 0xb) {
    if (iVar1 == 0xf) {
      uVar3 = 0xf;
      if (tbc == 5) goto LAB_00135491;
    }
    else {
      uVar3 = 0xf;
      if (tbc == 5 && iVar1 == 0x12) goto LAB_00135491;
    }
    uVar3 = tbc;
  }
LAB_00135491:
  *state = uVar3;
  return uVar4;
}

Assistant:

static utf8proc_bool grapheme_break_extended(int lbc, int tbc, utf8proc_int32_t *state)
{
  int lbc_override = ((state && *state != UTF8PROC_BOUNDCLASS_START)
                      ? *state : lbc);
  utf8proc_bool break_permitted = grapheme_break_simple(lbc_override, tbc);
  if (state) {
    // Special support for GB 12/13 made possible by GB999. After two RI
    // class codepoints we want to force a break. Do this by resetting the
    // second RI's bound class to UTF8PROC_BOUNDCLASS_OTHER, to force a break
    // after that character according to GB999 (unless of course such a break is
    // forbidden by a different rule such as GB9).
    if (*state == tbc && tbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR)
      *state = UTF8PROC_BOUNDCLASS_OTHER;
    // Special support for GB10. Fold any EXTEND codepoints into the previous
    // boundclass if we're dealing with an emoji base boundclass.
    else if ((*state == UTF8PROC_BOUNDCLASS_E_BASE      ||
              *state == UTF8PROC_BOUNDCLASS_E_BASE_GAZ) &&
             tbc == UTF8PROC_BOUNDCLASS_EXTEND)
      *state = UTF8PROC_BOUNDCLASS_E_BASE;
    else
      *state = tbc;
  }
  return break_permitted;
}